

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

int lys_set_enabled(lys_module *module)

{
  uint16_t *puVar1;
  ly_ctx *plVar2;
  lys_module *node;
  lys_node *plVar3;
  int iVar4;
  ly_set *mods;
  ly_set *set;
  char *pcVar5;
  ly_set *plVar6;
  lys_node *plVar7;
  lys_node *plVar8;
  LY_ERR *pLVar9;
  long lVar10;
  lys_import *plVar11;
  ulong uVar12;
  lys_ident *der;
  long lVar13;
  ulong uVar14;
  lys_node *leafref;
  ulong uVar15;
  lys_node *plVar16;
  bool bVar17;
  uint local_34 [2];
  uint s;
  
  if (module == (lys_module *)0x0) {
    pLVar9 = ly_errno_location();
    *pLVar9 = LY_EINVAL;
LAB_00110a87:
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
    if ((module->field_0x40 & 0x40) != 0) {
      plVar2 = module->ctx;
      lVar10 = 0;
      do {
        if ((plVar2->models).list[lVar10] == module) {
          pLVar9 = ly_errno_location();
          *pLVar9 = LY_EINVAL;
          ly_log(LY_LLERR,"Internal module \"%s\" cannot be removed.",module->name);
          goto LAB_00110a87;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 5);
      mods = ly_set_new();
      set = ly_set_new();
      lys_set_enabled_(mods,module);
      if (5 < (plVar2->models).used) {
        lVar10 = 5;
LAB_00110753:
        do {
          node = (plVar2->models).list[lVar10];
          if (((node->field_0x40 & 0x40) != 0) && (iVar4 = ly_set_contains(set,node), iVar4 == -1))
          {
            uVar12 = (ulong)node->imp_size;
            bVar17 = uVar12 != 0;
            if (bVar17) {
              plVar11 = node->imp;
              if ((plVar11->module->field_0x40 & 0x40) == 0) {
                uVar15 = 0;
                do {
                  plVar11 = plVar11 + 1;
                  if (uVar12 - 1 == uVar15) goto LAB_001107cd;
                  uVar15 = uVar15 + 1;
                } while ((plVar11->module->field_0x40 & 0x40) == 0);
                bVar17 = uVar15 < uVar12;
              }
              if (bVar17) goto LAB_00110776;
            }
LAB_001107cd:
            if (uVar12 != 0) {
              uVar15 = 0;
              do {
                if (mods->number != 0) {
                  lVar13 = 0;
                  do {
                    if (node->imp[uVar15].module == (lys_module *)(mods->set).s[lVar13]) {
                      node->field_0x40 = node->field_0x40 & 0xbf;
                      ly_set_add(mods,node,0);
                      lVar10 = 5;
                      if ((plVar2->models).used < 6) goto LAB_00110840;
                      goto LAB_00110753;
                    }
                    lVar13 = lVar13 + 1;
                  } while (mods->number != (uint)lVar13);
                }
                uVar15 = uVar15 + 1;
              } while (uVar15 != uVar12);
            }
            ly_set_add(set,node,0);
          }
LAB_00110776:
          lVar10 = lVar10 + 1;
        } while (lVar10 < (plVar2->models).used);
      }
LAB_00110840:
      if (mods->number != 0) {
        uVar12 = 0;
        do {
          plVar3 = (mods->set).s[uVar12];
          if (*(short *)((long)&plVar3->parent + 4) != 0) {
            uVar15 = 0;
            do {
              if (plVar3[1].dsc[uVar15 * 0x48 + 0x1f] != '\0') {
                der = (lys_ident *)(plVar3[1].dsc + uVar15 * 0x48);
                uVar14 = 0;
                do {
                  resolve_identity_backlink_update(der,der->base[uVar14]);
                  uVar14 = uVar14 + 1;
                  der = (lys_ident *)(plVar3[1].dsc + uVar15 * 0x48);
                } while (uVar14 < der->base_size);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < *(ushort *)((long)&plVar3->parent + 4));
          }
          if (*(char *)((long)&plVar3->parent + 7) != '\0') {
            uVar15 = 0;
            do {
              pcVar5 = plVar3[1].ref;
              lVar10 = uVar15 * 0x40;
              if (pcVar5[lVar10 + 0x1b] != '\0') {
                uVar14 = 0;
                do {
                  resolve_iffeature_getsizes
                            ((lys_iffeature *)(*(long *)(pcVar5 + lVar10 + 0x28) + uVar14 * 0x20),
                             (uint *)0x0,local_34);
                  while (bVar17 = local_34[0] != 0, local_34[0] = local_34[0] - 1, bVar17) {
                    lVar13 = *(long *)(*(long *)(*(long *)(plVar3[1].ref + lVar10 + 0x28) + 0x10 +
                                                uVar14 * 0x20) + (ulong)local_34[0] * 8);
                    if (*(long *)(lVar13 + 0x38) == 0) {
                      plVar6 = ly_set_new();
                      *(ly_set **)(lVar13 + 0x38) = plVar6;
                    }
                    ly_set_add(*(ly_set **)(lVar13 + 0x38),plVar3[1].ref + lVar10,1);
                  }
                  uVar14 = uVar14 + 1;
                  pcVar5 = plVar3[1].ref;
                } while (uVar14 < (byte)pcVar5[lVar10 + 0x1b]);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < *(byte *)((long)&plVar3->parent + 7));
          }
          plVar16 = *(lys_node **)&plVar3[1].nodetype;
joined_r0x00110968:
          leafref = plVar16;
          if (leafref != (lys_node *)0x0) {
            if (((leafref->nodetype & (LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN) &&
               (iVar4._0_2_ = leafref[1].flags, iVar4._2_1_ = leafref[1].ext_size,
               iVar4._3_1_ = leafref[1].iffeature_size, iVar4 == 9)) {
              lys_leaf_add_leafref_target((lys_node_leaf *)leafref[1].parent,leafref);
            }
            if ((leafref->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
              plVar16 = leafref->child;
            }
            else {
              plVar16 = (lys_node *)0x0;
            }
            if (plVar16 != (lys_node *)0x0) goto LAB_001109bb;
            if (leafref == *(lys_node **)&plVar3[1].nodetype) goto LAB_001109fd;
            do {
              plVar16 = leafref->next;
LAB_001109bb:
              if (plVar16 != (lys_node *)0x0) break;
              leafref = leafref->parent;
              if (leafref->nodetype == LYS_AUGMENT) {
                leafref = leafref->prev;
              }
              plVar7 = lys_parent(leafref);
              plVar8 = lys_parent(*(lys_node **)&plVar3[1].nodetype);
            } while (plVar7 != plVar8);
            goto joined_r0x00110968;
          }
LAB_001109fd:
          uVar12 = uVar12 + 1;
        } while (uVar12 < mods->number);
      }
      if (mods->number != 0) {
        uVar12 = 0;
        do {
          lys_sub_module_apply_devs_augs((lys_module *)(mods->set).s[uVar12]);
          uVar12 = uVar12 + 1;
        } while (uVar12 < mods->number);
      }
      ly_set_free(mods);
      ly_set_free(set);
      puVar1 = &(plVar2->models).module_set_id;
      *puVar1 = *puVar1 + 1;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

API int
lys_set_enabled(const struct lys_module *module)
{
    struct ly_ctx *ctx; /* shortcut */
    struct lys_module *mod;
    struct ly_set *mods, *disabled;
    int i;
    unsigned int u, v;

    if (!module) {
        ly_errno = LY_EINVAL;
        return EXIT_FAILURE;
    } else if (!module->disabled) {
        /* already enabled module */
        return EXIT_SUCCESS;
    }
    mod = (struct lys_module *)module;
    ctx = mod->ctx;

    /* avoid disabling internal modules */
    for (i = 0; i < INTERNAL_MODULES_COUNT; i++) {
        if (mod == ctx->models.list[i]) {
            LOGERR(LY_EINVAL, "Internal module \"%s\" cannot be removed.", mod->name);
            return EXIT_FAILURE;
        }
    }

    mods = ly_set_new();
    disabled = ly_set_new();

    /* enable the module, including its dependencies */
    lys_set_enabled_(mods, mod);

    /* we will go through the all disabled modules in the context, if the module has no dependency (import)
     * that is still disabled AND at least one of its imported module is from the set we are enabling now,
     * it is going to be also enabled. This way we try to revert everething that was possibly done by
     * lys_set_disabled(). */
checkdependency:
    for (i = INTERNAL_MODULES_COUNT; i < ctx->models.used; i++) {
        mod = ctx->models.list[i]; /* shortcut */
        if (!mod->disabled || ly_set_contains(disabled, mod) != -1) {
            /* skip the enabled modules */
            continue;
        }

        /* check imported modules */
        for (u = 0; u < mod->imp_size; u++) {
            if (mod->imp[u].module->disabled) {
                /* it has disabled dependency so it must stay disabled */
                break;
            }
        }
        if (u < mod->imp_size) {
            /* it has disabled dependency, continue with the next module in the context */
            continue;
        }

        /* get know if at least one of the imported modules is being enabled this time */
        for (u = 0; u < mod->imp_size; u++) {
            for (v = 0; v < mods->number; v++) {
                if (mod->imp[u].module == mods->set.g[v]) {
                    /* yes, it is, so they are connected and we are going to enable it as well,
                     * it is not necessary to call recursive lys_set_enable_() because we already
                     * know that there is no disabled import to enable */
                    mod->disabled = 0;
                    ly_set_add(mods, mod, 0);
                    /* we have to start again because some of the already checked modules can
                     * depend on the one we have just decided to enable */
                    goto checkdependency;
                }
            }
        }

        /* this module is disabled, but it does not depend on any other disabled module and none
         * of its imports was not enabled in this call. No future enabling of the disabled module
         * will change this so we can remember the module and skip it next time we will have to go
         * through the all context because of the checkdependency goto.
         */
        ly_set_add(disabled, mod, 0);
    }

    /* maintain backlinks (start with internal ietf-yang-library which have leafs as possible targets of leafrefs */
    ctx_modules_redo_backlinks(mods);

    /* re-apply the deviations and augments */
    for (v = 0; v < mods->number; v++) {
        lys_sub_module_apply_devs_augs((struct lys_module *)mods->set.g[v]);
    }

    /* free the sets */
    ly_set_free(mods);
    ly_set_free(disabled);

    /* update the module-set-id */
    ctx->models.module_set_id++;

    return EXIT_SUCCESS;
}